

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_unit.c
# Opt level: O0

void setandextract_uint32(void)

{
  uint uVar1;
  void *__ptr;
  void *__ptr_00;
  uint k_1;
  uint64_t *unaff_retaddr;
  uint32_t *newvals;
  uint k;
  uint64_t *bitset;
  uint16_t *vals;
  uint valsize;
  uint offset;
  uint bitset_size_in_words;
  uint bitset_size;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  uint64_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  uVar5 = 0x10000;
  uVar4 = 0x400;
  for (uVar3 = 1; uVar3 < 0x10000; uVar3 = uVar3 + 1) {
    uVar1 = (uint)(0x10000 / (ulong)uVar3);
    __ptr = malloc(0x10000 / (ulong)uVar3 << 1);
    __ptr_00 = calloc(0x400,8);
    for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
      *(short *)((long)__ptr + (ulong)uVar2 * 2) = (short)uVar2 * (short)uVar3;
    }
    bitset_set_list(in_stack_ffffffffffffffd0,
                    (uint16_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                    0x102c3d);
    in_stack_ffffffffffffffd0 = (uint64_t *)malloc((ulong)uVar1 << 2);
    bitset_extract_setbits
              (unaff_retaddr,CONCAT44(uVar5,uVar4),(uint32_t *)CONCAT44(uVar3,uVar1),
               (uint32_t)((ulong)__ptr >> 0x20));
    for (in_stack_ffffffffffffffcc = 0; in_stack_ffffffffffffffcc < uVar1;
        in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc + 1) {
      _assert_int_equal((unsigned_long)__ptr_00,CONCAT44(uVar2,in_stack_ffffffffffffffd8),
                        (char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    }
    free(__ptr);
    free(in_stack_ffffffffffffffd0);
    free(__ptr_00);
  }
  return;
}

Assistant:

DEFINE_TEST(setandextract_uint32) {
    const unsigned int bitset_size = 1 << 16;
    const unsigned int bitset_size_in_words =
        bitset_size / (sizeof(uint64_t) * 8);

    for (unsigned int offset = 1; offset < bitset_size; offset++) {
        const unsigned int valsize = bitset_size / offset;
        uint16_t* vals = (uint16_t*)malloc(valsize * sizeof(uint16_t));
        uint64_t* bitset =
            (uint64_t*)calloc(bitset_size_in_words, sizeof(uint64_t));

        for (unsigned int k = 0; k < valsize; ++k) {
            vals[k] = (uint16_t)(k * offset);
        }

        bitset_set_list(bitset, vals, valsize);
        uint32_t* newvals = (uint32_t*)malloc(valsize * sizeof(uint32_t));
        bitset_extract_setbits(bitset, bitset_size_in_words, newvals, 0);

        for (unsigned int k = 0; k < valsize; ++k) {
            assert_int_equal(newvals[k], vals[k]);
        }

        free(vals);
        free(newvals);
        free(bitset);
    }
}